

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteAnimationLibrary(ColladaExporter *this,size_t pIndex)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  string *psVar10;
  ostream *poVar11;
  float *pfVar12;
  size_type sVar13;
  float *pfVar14;
  reference pvVar15;
  allocator<char> local_831;
  string local_830;
  string local_810;
  allocator<char> local_7e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  string local_7a8;
  long local_788;
  aiNodeAnim *nodeAnim_2;
  size_t a_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  string local_730;
  allocator<char> local_709;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  string local_6c8;
  allocator<char> local_6a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  string local_660;
  string local_640;
  allocator<char> local_619;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  undefined1 local_5f8 [8];
  string node_idstr_2;
  aiNodeAnim *nodeAnim_1;
  size_t a_2;
  size_t a_1;
  string local_5a0;
  undefined1 local_580 [8];
  string arrayId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  undefined1 local_538 [8];
  string node_idstr_1;
  value_type local_510;
  allocator<char> local_4e9;
  value_type local_4e8;
  ulong local_4c8;
  size_t i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_4a0;
  const_iterator local_498;
  uint local_48c;
  uint j;
  undefined1 local_448 [8];
  aiMatrix4x4 mat;
  aiMatrix4x4 TranslationM;
  aiVector3D Translation;
  aiMatrix4x4 RotationM;
  undefined1 local_358 [8];
  aiMatrix4x4 s;
  aiQuaternion RotationQ;
  undefined1 local_300 [8];
  aiMatrix4x4 ScalingM;
  aiVector3D Scaling;
  size_t i_1;
  vector<float,_std::allocator<float>_> keyframes;
  string local_288 [36];
  float local_264;
  ulong local_260;
  size_t i;
  vector<float,_std::allocator<float>_> frames;
  string local_238 [32];
  long local_218;
  aiNodeAnim *nodeAnim;
  size_t a;
  string node_idstr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string idstrEscaped;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string ending;
  undefined1 local_98 [8];
  string idstr;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string animation_name_escaped;
  aiAnimation *anim;
  size_t pIndex_local;
  ColladaExporter *this_local;
  
  animation_name_escaped.field_2._8_8_ = this->mScene->mAnimations[pIndex];
  if (((((aiAnimation *)animation_name_escaped.field_2._8_8_)->mNumChannels != 0) ||
      (((aiAnimation *)animation_name_escaped.field_2._8_8_)->mNumMeshChannels != 0)) ||
     (((aiAnimation *)animation_name_escaped.field_2._8_8_)->mNumMorphMeshChannels != 0)) {
    pcVar5 = aiString::C_Str((aiString *)animation_name_escaped.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar5,&local_61);
    XMLEscape((string *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    pcVar5 = aiString::C_Str((aiString *)animation_name_escaped.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,pcVar5,(allocator<char> *)(ending.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(ending.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"AnimId",&local_e1);
    to_string<unsigned_long>(&local_108,pIndex);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   &local_e0,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    uVar6 = std::__cxx11::string::length();
    uVar7 = std::__cxx11::string::length();
    if (uVar6 < uVar7) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&idstrEscaped.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
      std::__cxx11::string::operator=
                ((string *)local_98,(string *)(idstrEscaped.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(idstrEscaped.field_2._M_local_buf + 8));
    }
    else {
      lVar8 = std::__cxx11::string::length();
      lVar9 = std::__cxx11::string::length();
      psVar10 = (string *)std::__cxx11::string::length();
      iVar4 = std::__cxx11::string::compare((ulong)local_98,lVar8 - lVar9,psVar10);
      if (iVar4 != 0) {
        std::operator+(&local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_c0);
        std::__cxx11::string::operator=((string *)local_98,(string *)&local_128);
        std::__cxx11::string::~string((string *)&local_128);
      }
    }
    XMLIDEncode((string *)local_168,(string *)local_98);
    poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&node_idstr.field_2 + 8),"<animation id=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
    std::operator+(&local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&node_idstr.field_2 + 8),"\" name=\"");
    std::operator+(&local_1a8,&local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+(&local_188,&local_1a8,"\">");
    poVar11 = std::operator<<(poVar11,(string *)&local_188);
    std::operator<<(poVar11,(string *)&this->endstr);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)(node_idstr.field_2._M_local_buf + 8));
    PushTag(this);
    std::__cxx11::string::string((string *)&a);
    for (nodeAnim = (aiNodeAnim *)0x0;
        nodeAnim < (aiNodeAnim *)(ulong)*(uint *)(animation_name_escaped.field_2._8_8_ + 0x418);
        nodeAnim = (aiNodeAnim *)((long)&(nodeAnim->mNodeName).length + 1)) {
      local_218 = *(long *)(*(long *)(animation_name_escaped.field_2._8_8_ + 0x420) +
                           (long)nodeAnim * 8);
      if ((*(int *)(local_218 + 0x404) == *(int *)(local_218 + 0x420)) &&
         (*(int *)(local_218 + 0x404) == *(int *)(local_218 + 0x410))) {
        std::__cxx11::string::clear();
        std::__cxx11::string::operator+=((string *)&a,(char *)(local_218 + 4));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_238,"_matrix-input",
                   (allocator<char> *)
                   ((long)&frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::operator+=((string *)&a,local_238);
        std::__cxx11::string::~string(local_238);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&frames.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&i);
        for (local_260 = 0; local_260 < *(uint *)(local_218 + 0x404); local_260 = local_260 + 1) {
          local_264 = (float)*(double *)(*(long *)(local_218 + 0x408) + local_260 * 0x18);
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)&i,&local_264);
        }
        pfVar12 = std::vector<float,_std::allocator<float>_>::data
                            ((vector<float,_std::allocator<float>_> *)&i);
        sVar13 = std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)&i);
        WriteFloatArray(this,(string *)&a,FloatType_Time,pfVar12,sVar13);
        std::vector<float,_std::allocator<float>_>::clear
                  ((vector<float,_std::allocator<float>_> *)&i);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)&i);
        std::__cxx11::string::clear();
        std::__cxx11::string::operator+=((string *)&a,(char *)(local_218 + 4));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_288,"_matrix-output",
                   (allocator<char> *)
                   ((long)&keyframes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::operator+=((string *)&a,local_288);
        std::__cxx11::string::~string(local_288);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&keyframes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&i_1);
        std::vector<float,_std::allocator<float>_>::reserve
                  ((vector<float,_std::allocator<float>_> *)&i_1,
                   (ulong)(uint)(*(int *)(local_218 + 0x404) << 4));
        for (stack0xfffffffffffffd50 = 0; stack0xfffffffffffffd50 < *(uint *)(local_218 + 0x404);
            register0x00000000 = stack0xfffffffffffffd50 + 1) {
          fVar1 = *(float *)(*(long *)(local_218 + 0x428) + 0x10 + stack0xfffffffffffffd50 * 0x18);
          ScalingM._56_8_ =
               *(undefined8 *)(*(long *)(local_218 + 0x428) + 8 + stack0xfffffffffffffd50 * 0x18);
          aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_300);
          fVar3 = ScalingM.d3;
          pfVar12 = aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)local_300,0);
          *pfVar12 = fVar3;
          fVar3 = ScalingM.d4;
          pfVar12 = aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)local_300,1);
          pfVar12[1] = fVar3;
          pfVar12 = aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)local_300,2);
          pfVar12[2] = fVar1;
          s._56_8_ = *(undefined8 *)
                      (*(long *)(local_218 + 0x418) + 8 + stack0xfffffffffffffd50 * 0x18);
          aiQuaterniont<float>::GetMatrix
                    ((aiMatrix3x3t<float> *)&RotationM.d3,(aiQuaterniont<float> *)&s.d3);
          aiMatrix4x4t<float>::aiMatrix4x4t
                    ((aiMatrix4x4t<float> *)local_358,(aiMatrix3x3t<float> *)&RotationM.d3);
          aiMatrix4x4t<float>::aiMatrix4x4t
                    ((aiMatrix4x4t<float> *)&Translation.y,(float)local_358._0_4_,
                     (float)local_358._4_4_,s.a1,0.0,s.a3,s.a4,s.b1,0.0,s.b3,s.b4,s.c1,0.0,0.0,0.0,
                     0.0,1.0);
          Translation.x =
               *(float *)(*(long *)(local_218 + 0x408) + 0x10 + stack0xfffffffffffffd50 * 0x18);
          uVar2 = *(undefined8 *)(*(long *)(local_218 + 0x408) + 8 + stack0xfffffffffffffd50 * 0x18)
          ;
          aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&mat.d3);
          TranslationM.d3 = (float)uVar2;
          pfVar12 = aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)&mat.d3,0);
          pfVar12[3] = TranslationM.d3;
          TranslationM.d4 = (float)((ulong)uVar2 >> 0x20);
          pfVar12 = aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)&mat.d3,1);
          fVar1 = Translation.x;
          pfVar12[3] = TranslationM.d4;
          pfVar12 = aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)&mat.d3,2);
          pfVar12[3] = fVar1;
          aiMatrix4x4t<float>::operator*
                    ((aiMatrix4x4t<float> *)&stack0xfffffffffffffb78,(aiMatrix4x4t<float> *)&mat.d3,
                     (aiMatrix4x4t<float> *)&Translation.y);
          aiMatrix4x4t<float>::operator*
                    ((aiMatrix4x4t<float> *)local_448,
                     (aiMatrix4x4t<float> *)&stack0xfffffffffffffb78,
                     (aiMatrix4x4t<float> *)local_300);
          for (local_48c = 0; local_48c < 4; local_48c = local_48c + 1) {
            local_4a0._M_current =
                 (float *)std::vector<float,_std::allocator<float>_>::end
                                    ((vector<float,_std::allocator<float>_> *)&i_1);
            __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
            __normal_iterator<float*>
                      ((__normal_iterator<float_const*,std::vector<float,std::allocator<float>>> *)
                       &local_498,&local_4a0);
            pfVar12 = aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)local_448,local_48c);
            pfVar14 = aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)local_448,local_48c);
            names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)std::vector<float,std::allocator<float>>::insert<float*,void>
                                    ((vector<float,std::allocator<float>> *)&i_1,local_498,pfVar12,
                                     pfVar14 + 4);
          }
        }
        pfVar12 = std::vector<float,_std::allocator<float>_>::data
                            ((vector<float,_std::allocator<float>_> *)&i_1);
        sVar13 = std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)&i_1);
        WriteFloatArray(this,(string *)&a,FloatType_Mat4x4,pfVar12,sVar13 >> 4);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)&i_1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i_2);
        for (local_4c8 = 0; local_4c8 < *(uint *)(local_218 + 0x404); local_4c8 = local_4c8 + 1) {
          if (((*(int *)(local_218 + 0x430) == 0) || (*(int *)(local_218 + 0x430) == 2)) ||
             (*(int *)(local_218 + 0x430) == 3)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4e8,"LINEAR",&local_4e9);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&i_2,&local_4e8);
            std::__cxx11::string::~string((string *)&local_4e8);
            std::allocator<char>::~allocator(&local_4e9);
          }
          else if (*(int *)(local_218 + 0x434) == 1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_510,"STEP",
                       (allocator<char> *)(node_idstr_1.field_2._M_local_buf + 0xf));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&i_2,&local_510);
            std::__cxx11::string::~string((string *)&local_510);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(node_idstr_1.field_2._M_local_buf + 0xf));
          }
        }
        pcVar5 = (char *)(local_218 + 4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_558,"_matrix-interpolation",
                   (allocator<char> *)(arrayId.field_2._M_local_buf + 0xf));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_538,pcVar5,&local_558);
        std::__cxx11::string::~string((string *)&local_558);
        std::allocator<char>::~allocator((allocator<char> *)(arrayId.field_2._M_local_buf + 0xf));
        XMLIDEncode(&local_5a0,(string *)local_538);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_580,&local_5a0,"-array");
        std::__cxx11::string::~string((string *)&local_5a0);
        poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar11 = std::operator<<(poVar11,"<source id=\"");
        XMLIDEncode((string *)&a_1,(string *)local_538);
        poVar11 = std::operator<<(poVar11,(string *)&a_1);
        poVar11 = std::operator<<(poVar11,"\">");
        std::operator<<(poVar11,(string *)&this->endstr);
        std::__cxx11::string::~string((string *)&a_1);
        PushTag(this);
        poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar11 = std::operator<<(poVar11,"<Name_array id=\"");
        poVar11 = std::operator<<(poVar11,(string *)local_580);
        poVar11 = std::operator<<(poVar11,"\" count=\"");
        sVar13 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&i_2);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,sVar13);
        std::operator<<(poVar11,"\"> ");
        for (a_2 = 0; sVar13 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&i_2), a_2 < sVar13; a_2 = a_2 + 1) {
          pvVar15 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&i_2,a_2);
          poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)pvVar15);
          std::operator<<(poVar11," ");
        }
        poVar11 = std::operator<<((ostream *)&this->field_0x38,"</Name_array>");
        std::operator<<(poVar11,(string *)&this->endstr);
        poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar11 = std::operator<<(poVar11,"<technique_common>");
        std::operator<<(poVar11,(string *)&this->endstr);
        PushTag(this);
        poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar11 = std::operator<<(poVar11,"<accessor source=\"#");
        poVar11 = std::operator<<(poVar11,(string *)local_580);
        poVar11 = std::operator<<(poVar11,"\" count=\"");
        sVar13 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&i_2);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,sVar13);
        poVar11 = std::operator<<(poVar11,"\" stride=\"");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,1);
        poVar11 = std::operator<<(poVar11,"\">");
        std::operator<<(poVar11,(string *)&this->endstr);
        PushTag(this);
        poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar11 = std::operator<<(poVar11,"<param name=\"INTERPOLATION\" type=\"name\"></param>");
        std::operator<<(poVar11,(string *)&this->endstr);
        PopTag(this);
        poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar11 = std::operator<<(poVar11,"</accessor>");
        std::operator<<(poVar11,(string *)&this->endstr);
        PopTag(this);
        poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar11 = std::operator<<(poVar11,"</technique_common>");
        std::operator<<(poVar11,(string *)&this->endstr);
        PopTag(this);
        poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar11 = std::operator<<(poVar11,"</source>");
        std::operator<<(poVar11,(string *)&this->endstr);
        std::__cxx11::string::~string((string *)local_580);
        std::__cxx11::string::~string((string *)local_538);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i_2);
      }
    }
    for (nodeAnim_1 = (aiNodeAnim *)0x0;
        nodeAnim_1 < (aiNodeAnim *)(ulong)*(uint *)(animation_name_escaped.field_2._8_8_ + 0x418);
        nodeAnim_1 = (aiNodeAnim *)((long)&(nodeAnim_1->mNodeName).length + 1)) {
      node_idstr_2.field_2._8_8_ =
           *(long *)(*(long *)(animation_name_escaped.field_2._8_8_ + 0x420) + (long)nodeAnim_1 * 8)
      ;
      pcVar5 = (char *)(node_idstr_2.field_2._8_8_ + 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_618,"_matrix-sampler",&local_619);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8,
                     pcVar5,&local_618);
      std::__cxx11::string::~string((string *)&local_618);
      std::allocator<char>::~allocator(&local_619);
      poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar11 = std::operator<<(poVar11,"<sampler id=\"");
      XMLIDEncode(&local_640,(string *)local_5f8);
      poVar11 = std::operator<<(poVar11,(string *)&local_640);
      poVar11 = std::operator<<(poVar11,"\">");
      std::operator<<(poVar11,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_640);
      PushTag(this);
      poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar11 = std::operator<<(poVar11,"<input semantic=\"INPUT\" source=\"#");
      pcVar5 = (char *)(node_idstr_2.field_2._8_8_ + 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a0,"_matrix-input",&local_6a1);
      std::operator+(&local_680,pcVar5,&local_6a0);
      XMLIDEncode(&local_660,&local_680);
      poVar11 = std::operator<<(poVar11,(string *)&local_660);
      poVar11 = std::operator<<(poVar11,"\"/>");
      std::operator<<(poVar11,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_660);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::allocator<char>::~allocator(&local_6a1);
      poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar11 = std::operator<<(poVar11,"<input semantic=\"OUTPUT\" source=\"#");
      pcVar5 = (char *)(node_idstr_2.field_2._8_8_ + 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_708,"_matrix-output",&local_709);
      std::operator+(&local_6e8,pcVar5,&local_708);
      XMLIDEncode(&local_6c8,&local_6e8);
      poVar11 = std::operator<<(poVar11,(string *)&local_6c8);
      poVar11 = std::operator<<(poVar11,"\"/>");
      std::operator<<(poVar11,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_6c8);
      std::__cxx11::string::~string((string *)&local_6e8);
      std::__cxx11::string::~string((string *)&local_708);
      std::allocator<char>::~allocator(&local_709);
      poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar11 = std::operator<<(poVar11,"<input semantic=\"INTERPOLATION\" source=\"#");
      pcVar5 = (char *)(node_idstr_2.field_2._8_8_ + 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_770,"_matrix-interpolation",(allocator<char> *)((long)&a_3 + 7));
      std::operator+(&local_750,pcVar5,&local_770);
      XMLIDEncode(&local_730,&local_750);
      poVar11 = std::operator<<(poVar11,(string *)&local_730);
      poVar11 = std::operator<<(poVar11,"\"/>");
      std::operator<<(poVar11,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_750);
      std::__cxx11::string::~string((string *)&local_770);
      std::allocator<char>::~allocator((allocator<char> *)((long)&a_3 + 7));
      PopTag(this);
      poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar11 = std::operator<<(poVar11,"</sampler>");
      std::operator<<(poVar11,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)local_5f8);
    }
    for (nodeAnim_2 = (aiNodeAnim *)0x0;
        nodeAnim_2 < (aiNodeAnim *)(ulong)*(uint *)(animation_name_escaped.field_2._8_8_ + 0x418);
        nodeAnim_2 = (aiNodeAnim *)((long)&(nodeAnim_2->mNodeName).length + 1)) {
      local_788 = *(long *)(*(long *)(animation_name_escaped.field_2._8_8_ + 0x420) +
                           (long)nodeAnim_2 * 8);
      poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar11 = std::operator<<(poVar11,"<channel source=\"#");
      pcVar5 = (char *)(local_788 + 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7e8,"_matrix-sampler",&local_7e9);
      std::operator+(&local_7c8,pcVar5,&local_7e8);
      XMLIDEncode(&local_7a8,&local_7c8);
      poVar11 = std::operator<<(poVar11,(string *)&local_7a8);
      poVar11 = std::operator<<(poVar11,"\" target=\"");
      pcVar5 = (char *)(local_788 + 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,pcVar5,&local_831);
      XMLIDEncode(&local_810,&local_830);
      poVar11 = std::operator<<(poVar11,(string *)&local_810);
      poVar11 = std::operator<<(poVar11,"/matrix\"/>");
      std::operator<<(poVar11,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_810);
      std::__cxx11::string::~string((string *)&local_830);
      std::allocator<char>::~allocator(&local_831);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::allocator<char>::~allocator(&local_7e9);
    }
    PopTag(this);
    poVar11 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar11 = std::operator<<(poVar11,"</animation>");
    std::operator<<(poVar11,(string *)&this->endstr);
    std::__cxx11::string::~string((string *)&a);
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void ColladaExporter::WriteAnimationLibrary(size_t pIndex)
{
	const aiAnimation * anim = mScene->mAnimations[pIndex];
	
	if ( anim->mNumChannels == 0 && anim->mNumMeshChannels == 0 && anim->mNumMorphMeshChannels ==0 )
		return;
	
	const std::string animation_name_escaped = XMLEscape( anim->mName.C_Str() );
	std::string idstr = anim->mName.C_Str();
	std::string ending = std::string( "AnimId" ) + to_string(pIndex);
	if (idstr.length() >= ending.length()) {
		if (0 != idstr.compare (idstr.length() - ending.length(), ending.length(), ending)) {
			idstr = idstr + ending;
		}
	} else {
		idstr = idstr + ending;
	}

	const std::string idstrEscaped = XMLIDEncode(idstr);
	
	mOutput << startstr << "<animation id=\"" + idstrEscaped + "\" name=\"" + animation_name_escaped + "\">" << endstr;
	PushTag();

    std::string node_idstr;
	for (size_t a = 0; a < anim->mNumChannels; ++a) {
		const aiNodeAnim * nodeAnim = anim->mChannels[a];
		
		// sanity check
		if ( nodeAnim->mNumPositionKeys != nodeAnim->mNumScalingKeys ||  nodeAnim->mNumPositionKeys != nodeAnim->mNumRotationKeys ) continue;
		
		{
            node_idstr.clear();
            node_idstr += nodeAnim->mNodeName.data;
            node_idstr += std::string( "_matrix-input" );

			std::vector<ai_real> frames;
			for( size_t i = 0; i < nodeAnim->mNumPositionKeys; ++i) {
				frames.push_back(static_cast<ai_real>(nodeAnim->mPositionKeys[i].mTime));
			}
			
			WriteFloatArray( node_idstr , FloatType_Time, (const ai_real*) frames.data(), frames.size());
			frames.clear();
		}
		
		{
            node_idstr.clear();

            node_idstr += nodeAnim->mNodeName.data;
            node_idstr += std::string("_matrix-output");
			
			std::vector<ai_real> keyframes;
			keyframes.reserve(nodeAnim->mNumPositionKeys * 16);
			for( size_t i = 0; i < nodeAnim->mNumPositionKeys; ++i) {
				aiVector3D Scaling = nodeAnim->mScalingKeys[i].mValue;
				aiMatrix4x4 ScalingM;  // identity
				ScalingM[0][0] = Scaling.x; ScalingM[1][1] = Scaling.y; ScalingM[2][2] = Scaling.z;
				
				aiQuaternion RotationQ = nodeAnim->mRotationKeys[i].mValue;
				aiMatrix4x4 s = aiMatrix4x4( RotationQ.GetMatrix() );
				aiMatrix4x4 RotationM(s.a1, s.a2, s.a3, 0, s.b1, s.b2, s.b3, 0, s.c1, s.c2, s.c3, 0, 0, 0, 0, 1);
				
				aiVector3D Translation = nodeAnim->mPositionKeys[i].mValue;
				aiMatrix4x4 TranslationM;	// identity
				TranslationM[0][3] = Translation.x; TranslationM[1][3] = Translation.y; TranslationM[2][3] = Translation.z;
				
				// Combine the above transformations
				aiMatrix4x4 mat = TranslationM * RotationM * ScalingM;
				
				for( unsigned int j = 0; j < 4; ++j) {
					keyframes.insert(keyframes.end(), mat[j], mat[j] + 4);
                }
			}
			
			WriteFloatArray( node_idstr, FloatType_Mat4x4, (const ai_real*) keyframes.data(), keyframes.size() / 16);
		}
		
		{
			std::vector<std::string> names;
			for ( size_t i = 0; i < nodeAnim->mNumPositionKeys; ++i) {
				if ( nodeAnim->mPreState == aiAnimBehaviour_DEFAULT
					|| nodeAnim->mPreState == aiAnimBehaviour_LINEAR
					|| nodeAnim->mPreState == aiAnimBehaviour_REPEAT
					) {
					names.push_back( "LINEAR" );
				} else if (nodeAnim->mPostState == aiAnimBehaviour_CONSTANT) {
					names.push_back( "STEP" );
				}
			}
			
			const std::string node_idstr = nodeAnim->mNodeName.data + std::string("_matrix-interpolation");
            std::string arrayId = XMLIDEncode(node_idstr) + "-array";
			
			mOutput << startstr << "<source id=\"" << XMLIDEncode(node_idstr) << "\">" << endstr;
			PushTag();
			
			// source array
			mOutput << startstr << "<Name_array id=\"" << arrayId << "\" count=\"" << names.size() << "\"> ";
			for( size_t a = 0; a < names.size(); ++a ) {
				mOutput << names[a] << " ";
            }
			mOutput << "</Name_array>" << endstr;
			
			mOutput << startstr << "<technique_common>" << endstr;
			PushTag();

			mOutput << startstr << "<accessor source=\"#" << arrayId << "\" count=\"" << names.size() << "\" stride=\"" << 1 << "\">" << endstr;
			PushTag();
			
			mOutput << startstr << "<param name=\"INTERPOLATION\" type=\"name\"></param>" << endstr;
			
			PopTag();
			mOutput << startstr << "</accessor>" << endstr;
			
			PopTag();
			mOutput << startstr << "</technique_common>" << endstr;

			PopTag();
			mOutput << startstr << "</source>" << endstr;
		}
	}
	
	for (size_t a = 0; a < anim->mNumChannels; ++a) {
		const aiNodeAnim * nodeAnim = anim->mChannels[a];
		
		{
		// samplers
			const std::string node_idstr = nodeAnim->mNodeName.data + std::string("_matrix-sampler");
			mOutput << startstr << "<sampler id=\"" << XMLIDEncode(node_idstr) << "\">" << endstr;
			PushTag();
			
			mOutput << startstr << "<input semantic=\"INPUT\" source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-input") ) << "\"/>" << endstr;
			mOutput << startstr << "<input semantic=\"OUTPUT\" source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-output") ) << "\"/>" << endstr;
			mOutput << startstr << "<input semantic=\"INTERPOLATION\" source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-interpolation") ) << "\"/>" << endstr;
			
			PopTag();
			mOutput << startstr << "</sampler>" << endstr;
		}
	}
	
	for (size_t a = 0; a < anim->mNumChannels; ++a) {
		const aiNodeAnim * nodeAnim = anim->mChannels[a];
		
		{
		// channels
			mOutput << startstr << "<channel source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-sampler") ) << "\" target=\"" << XMLIDEncode(nodeAnim->mNodeName.data) << "/matrix\"/>" << endstr;
		}
	}
	
	PopTag();
	mOutput << startstr << "</animation>" << endstr;
	
}